

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microsoft_pe.cpp
# Opt level: O2

ssize_t __thiscall
microsoft_pe_t::optional_header_data_dirs_t::_read
          (optional_header_data_dirs_t *this,int __fd,void *__buf,size_t __nbytes)

{
  microsoft_pe_t *pmVar1;
  data_dir_t *pdVar2;
  ssize_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_00,(size_t)pmVar1);
  this->m_export_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_01,(size_t)pmVar1);
  this->m_import_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_02,(size_t)pmVar1);
  this->m_resource_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_03,(size_t)pmVar1);
  this->m_exception_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_04,(size_t)pmVar1);
  this->m_certificate_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_05,(size_t)pmVar1);
  this->m_base_relocation_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_06,(size_t)pmVar1);
  this->m_debug = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_07,(size_t)pmVar1);
  this->m_architecture = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_08,(size_t)pmVar1);
  this->m_global_ptr = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_09,(size_t)pmVar1);
  this->m_tls_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_10,(size_t)pmVar1);
  this->m_load_config_table = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_11,(size_t)pmVar1);
  this->m_bound_import = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_12,(size_t)pmVar1);
  this->m_iat = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  data_dir_t::_read(pdVar2,__fd,__buf_13,(size_t)pmVar1);
  this->m_delay_import_descriptor = pdVar2;
  pdVar2 = (data_dir_t *)operator_new(0x20);
  pmVar1 = this->m__root;
  (pdVar2->super_kstruct).m__io = (this->super_kstruct).m__io;
  pdVar2->m__parent = this;
  pdVar2->m__root = pmVar1;
  sVar3 = data_dir_t::_read(pdVar2,__fd,__buf_14,(size_t)pmVar1);
  this->m_clr_runtime_header = pdVar2;
  return sVar3;
}

Assistant:

void microsoft_pe_t::optional_header_data_dirs_t::_read() {
    m_export_table = new data_dir_t(m__io, this, m__root);
    m_import_table = new data_dir_t(m__io, this, m__root);
    m_resource_table = new data_dir_t(m__io, this, m__root);
    m_exception_table = new data_dir_t(m__io, this, m__root);
    m_certificate_table = new data_dir_t(m__io, this, m__root);
    m_base_relocation_table = new data_dir_t(m__io, this, m__root);
    m_debug = new data_dir_t(m__io, this, m__root);
    m_architecture = new data_dir_t(m__io, this, m__root);
    m_global_ptr = new data_dir_t(m__io, this, m__root);
    m_tls_table = new data_dir_t(m__io, this, m__root);
    m_load_config_table = new data_dir_t(m__io, this, m__root);
    m_bound_import = new data_dir_t(m__io, this, m__root);
    m_iat = new data_dir_t(m__io, this, m__root);
    m_delay_import_descriptor = new data_dir_t(m__io, this, m__root);
    m_clr_runtime_header = new data_dir_t(m__io, this, m__root);
}